

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
calc_kurtosis_all_data<InputData<double,int>,double>
          (InputData<double,_int> *input_data,ModelParams *model_params,Xoshiro256PP *rnd_generator)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  double *Xc;
  reference pvVar5;
  reference pdVar6;
  vector<double,_std::allocator<double>_> *in_RCX;
  long lVar7;
  long lVar8;
  long in_RDX;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar9;
  size_t col_1;
  double *w;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  size_t col;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> buffer_size_t;
  unique_ptr<double[],_std::default_delete<double[]>_> buffer_double;
  vector<double,_std::allocator<double>_> *kurt_weights;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb8;
  undefined4 uVar10;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  allocator_type *in_stack_fffffffffffffed0;
  size_type in_stack_fffffffffffffed8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  long in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  size_t *in_stack_fffffffffffffef8;
  int ncat;
  int *x;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar11;
  CategSplit cat_split_type;
  double in_stack_ffffffffffffff20;
  Xoshiro256PP *in_stack_ffffffffffffff28;
  double *in_stack_ffffffffffffff30;
  double *in_stack_ffffffffffffff38;
  MissingAction MVar12;
  int *in_stack_ffffffffffffff40;
  undefined1 *nrows;
  void *in_stack_ffffffffffffff58;
  Xoshiro256PP *in_stack_ffffffffffffff60;
  vector<double,_std::allocator<double>_> *w_00;
  ulong local_88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_70 [2];
  ulong local_60;
  undefined1 local_52;
  undefined1 local_51;
  vector<double,_std::allocator<double>_> *local_20;
  long local_18;
  long local_10;
  
  w_00 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::unique_ptr<double[],std::default_delete<double[]>>::
  unique_ptr<std::default_delete<double[]>,void>
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0);
  std::unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>>::
  unique_ptr<std::default_delete<unsigned_long[]>,void>
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
             in_stack_fffffffffffffec0);
  if (*(long *)(local_10 + 0x28) != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*(int *)(local_10 + 0x20);
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    in_stack_ffffffffffffff60 = (Xoshiro256PP *)operator_new__(uVar4);
    std::unique_ptr<double[],std::default_delete<double[]>>::
    unique_ptr<double*,std::default_delete<double[]>,void,bool>
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0,
               (double *)in_stack_fffffffffffffeb8);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::operator=
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0,
               (unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffeb8);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0);
    if ((*(long *)(local_10 + 0x40) == 0) || ((*(byte *)(local_10 + 0x48) & 1) != 0)) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(*(int *)(local_10 + 0x20) + 1);
      uVar4 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      in_stack_ffffffffffffff58 = operator_new__(uVar4);
      std::unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>>::
      unique_ptr<unsigned_long*,std::default_delete<unsigned_long[]>,void,bool>
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_fffffffffffffec0,(unsigned_long *)in_stack_fffffffffffffeb8);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator=
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_fffffffffffffec0,
                 (unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_fffffffffffffeb8);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_fffffffffffffec0);
    }
  }
  local_51 = 0;
  Xc = (double *)(*(long *)(local_10 + 8) + *(long *)(local_10 + 0x28));
  nrows = &local_52;
  std::allocator<double>::allocator((allocator<double> *)0x1dc940);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::allocator<double>::~allocator((allocator<double> *)0x1dc96c);
  for (local_60 = 0; cat_split_type = SUB84(in_stack_ffffffffffffff20,0),
      local_60 < *(ulong *)(local_10 + 0x38); local_60 = local_60 + 1) {
    if (local_60 < *(ulong *)(local_10 + 8)) {
      if (*(long *)(local_10 + 0x68) == 0) {
        MVar12 = (MissingAction)((ulong)in_stack_ffffffffffffff38 >> 0x20);
        if ((*(long *)(local_10 + 0x40) == 0) || ((*(byte *)(local_10 + 0x48) & 1) != 0)) {
          in_stack_ffffffffffffff40 =
               (int *)calc_kurtosis<double,double>(Xc,(size_t)in_stack_ffffffffffffff40,MVar12);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_60);
          *pvVar5 = (value_type)in_stack_ffffffffffffff40;
        }
        else {
          in_stack_ffffffffffffff38 =
               (double *)
               calc_kurtosis_weighted<double,double>
                         (Xc,(size_t)in_stack_ffffffffffffff40,MVar12,in_stack_ffffffffffffff30);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_60);
          *pvVar5 = (value_type)in_stack_ffffffffffffff38;
        }
      }
      else {
        MVar12 = (MissingAction)((ulong)in_stack_ffffffffffffff30 >> 0x20);
        if ((*(long *)(local_10 + 0x40) == 0) || ((*(byte *)(local_10 + 0x48) & 1) != 0)) {
          in_stack_ffffffffffffff30 =
               (double *)
               calc_kurtosis<double,int,double>
                         ((size_t)in_stack_ffffffffffffff58,(size_t)nrows,Xc,
                          in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,MVar12);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_60);
          *pvVar5 = (value_type)in_stack_ffffffffffffff30;
        }
        else {
          in_stack_fffffffffffffeb8 = *(vector<double,_std::allocator<double>_> **)(local_10 + 0x40)
          ;
          in_stack_ffffffffffffff28 =
               (Xoshiro256PP *)
               calc_kurtosis_weighted<double,int,double>
                         ((size_t)in_stack_ffffffffffffff58,(size_t)nrows,Xc,
                          in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,MVar12,
                          (double *)w_00);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_60);
          *pvVar5 = (value_type)in_stack_ffffffffffffff28;
        }
      }
    }
    else if ((*(long *)(local_10 + 0x40) == 0) || ((*(byte *)(local_10 + 0x48) & 1) != 0)) {
      lVar8 = *(long *)(local_10 + 0x30);
      lVar7 = local_60 - *(long *)(local_10 + 8);
      x = (int *)(*(long *)(local_10 + 0x10) + lVar7 * lVar8 * 4);
      uVar11 = *(undefined4 *)(*(long *)(local_10 + 0x18) + lVar7 * 4);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_fffffffffffffec0);
      ncat = (int)((ulong)lVar8 >> 0x20);
      uVar10 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
      std::unique_ptr<double[],_std::default_delete<double[]>_>::get
                ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffeb8 =
           (vector<double,_std::allocator<double>_> *)
           CONCAT44(uVar10,*(undefined4 *)(local_18 + 0x80));
      in_stack_fffffffffffffec0 = local_20;
      in_stack_ffffffffffffff20 =
           calc_kurtosis<double>
                     (CONCAT44(uVar11,in_stack_ffffffffffffff10),x,ncat,in_stack_fffffffffffffef8,
                      (double *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (MissingAction)((ulong)in_stack_fffffffffffffee8 >> 0x20),cat_split_type,
                      in_stack_ffffffffffffff28);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_60);
      *pvVar5 = in_stack_ffffffffffffff20;
    }
    else {
      lVar8 = local_60 - *(long *)(local_10 + 8);
      in_stack_fffffffffffffee8 =
           *(long *)(local_10 + 0x10) + lVar8 * *(long *)(local_10 + 0x30) * 4;
      in_stack_fffffffffffffef4 = *(undefined4 *)(*(long *)(local_10 + 0x18) + lVar8 * 4);
      std::unique_ptr<double[],_std::default_delete<double[]>_>::get
                ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffec0 = *(vector<double,_std::allocator<double>_> **)(local_10 + 0x40);
      in_stack_fffffffffffffeb8 = local_20;
      in_stack_fffffffffffffef8 =
           (size_t *)
           calc_kurtosis_weighted<double,double>
                     ((size_t)nrows,(int *)Xc,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                      in_stack_ffffffffffffff38,
                      (MissingAction)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                      (CategSplit)in_stack_ffffffffffffff30,in_stack_ffffffffffffff60,
                      (double *)in_RDI);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_60);
      *pvVar5 = (value_type)in_stack_fffffffffffffef8;
    }
  }
  local_70[0]._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffeb8);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffec0,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffeb8), bVar3) {
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(local_70);
    if ((*pdVar6 != -INFINITY) || (NAN(*pdVar6))) {
      dVar9 = *pdVar6 + -1.0;
      if (dVar9 <= 1e-08) {
        dVar9 = 1e-08;
      }
    }
    else {
      dVar9 = 0.0;
    }
    *pdVar6 = dVar9;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(local_70);
  }
  if (*(long *)(local_10 + 0x50) != 0) {
    for (local_88 = 0; local_88 < *(ulong *)(local_10 + 0x38); local_88 = local_88 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_88);
      if (0.0 < *pvVar5) {
        dVar9 = *(double *)(*(long *)(local_10 + 0x50) + local_88 * 8);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_88);
        *pvVar5 = dVar9 * *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_88);
        dVar9 = *pvVar5;
        if (dVar9 <= 1e-100) {
          dVar9 = 1e-100;
        }
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_88);
        *pvVar5 = dVar9;
      }
    }
  }
  local_51 = 1;
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
             in_stack_fffffffffffffec0);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0);
  return w_00;
}

Assistant:

std::vector<double> calc_kurtosis_all_data(InputData &input_data, ModelParams &model_params, RNG_engine &rnd_generator)
{
    std::unique_ptr<double[]> buffer_double;
    std::unique_ptr<size_t[]> buffer_size_t;
    if (input_data.ncols_categ)
    {
        buffer_double = std::unique_ptr<double[]>(new double[input_data.max_categ]);
        if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            buffer_size_t = std::unique_ptr<size_t[]>(new size_t[input_data.max_categ + 1]);
    }


    std::vector<double> kurt_weights(input_data.ncols_numeric + input_data.ncols_categ);
    for (size_t col = 0; col < input_data.ncols_tot; col++)
    {
        if (col < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr == NULL)
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.numeric_data)>::type, ldouble_safe>(
                                        input_data.numeric_data + col * input_data.nrows,
                                        input_data.nrows, model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                                 ldouble_safe>(
                                                 input_data.numeric_data + col * input_data.nrows, input_data.nrows,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }

            else
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                        typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                        ldouble_safe>(
                                        col, input_data.nrows,
                                        input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                        model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                                 typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                                 ldouble_safe>(
                                                 col, input_data.nrows,
                                                 input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }
        }

        else
        {
            if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            {
                kurt_weights[col]
                        = calc_kurtosis<ldouble_safe>(input_data.nrows,
                                        input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                        input_data.ncat[col - input_data.ncols_numeric],
                                        buffer_size_t.get(), buffer_double.get(),
                                        model_params.missing_action, model_params.cat_split_type, rnd_generator);
            }

            else
            {
                kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.sample_weights)>::type,
                                                 ldouble_safe>(
                                                 input_data.nrows,
                                                 input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                                 input_data.ncat[col - input_data.ncols_numeric],
                                                 buffer_double.get(),
                                                 model_params.missing_action, model_params.cat_split_type,
                                                 rnd_generator, input_data.sample_weights);
            }
        }
    }

    for (auto &w : kurt_weights) w = (w == -HUGE_VAL)? 0. : std::fmax(1e-8, -1. + w);
    if (input_data.col_weights != NULL)
    {
        for (size_t col = 0; col < input_data.ncols_tot; col++)
        {
            if (kurt_weights[col] <= 0) continue;
            kurt_weights[col] *= input_data.col_weights[col];
            kurt_weights[col] = std::fmax(kurt_weights[col], 1e-100);
        }
    }

    return kurt_weights;
}